

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMvMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  undefined4 uVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  NodeRef *pNVar49;
  AABBNodeMB4D *node1;
  ulong uVar50;
  ulong uVar51;
  undefined4 uVar52;
  ulong uVar53;
  ulong unaff_RBP;
  size_t mask;
  size_t sVar54;
  ulong uVar55;
  ulong uVar56;
  long lVar57;
  bool bVar58;
  bool bVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar67;
  float fVar76;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar75 [32];
  float fVar77;
  undefined1 in_ZMM1 [64];
  float fVar78;
  undefined1 extraout_var [56];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 in_ZMM2 [64];
  float fVar91;
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  float fVar102;
  float fVar105;
  float fVar106;
  undefined1 auVar103 [16];
  float fVar107;
  undefined1 auVar104 [16];
  uint uVar108;
  uint uVar110;
  uint uVar111;
  undefined1 auVar109 [16];
  uint uVar112;
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  float fVar115;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  ulong local_1518;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  ulong local_14a0;
  ulong local_1498;
  ulong local_1490;
  ulong local_1488;
  ulong local_1480;
  NodeRef *local_1478;
  ulong local_1470;
  undefined8 *local_1468;
  NodeRef *local_1460;
  RTCFilterFunctionNArguments args;
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [16];
  float local_12c8 [4];
  undefined1 local_12b8 [16];
  undefined1 local_12a8 [16];
  undefined8 local_1298;
  undefined8 uStack_1290;
  RTCHitN local_1288 [16];
  undefined4 local_1278;
  undefined4 uStack_1274;
  undefined4 uStack_1270;
  undefined4 uStack_126c;
  undefined4 local_1268;
  undefined4 uStack_1264;
  undefined4 uStack_1260;
  undefined4 uStack_125c;
  undefined1 local_1258 [16];
  undefined1 local_1248 [16];
  undefined1 local_1238 [16];
  undefined1 local_1228 [16];
  uint local_1218;
  uint uStack_1214;
  uint uStack_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  uint uStack_1200;
  uint uStack_11fc;
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  stack[0] = root;
  uVar52 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar97._4_4_ = uVar52;
  auVar97._0_4_ = uVar52;
  auVar97._8_4_ = uVar52;
  auVar97._12_4_ = uVar52;
  auVar97._16_4_ = uVar52;
  auVar97._20_4_ = uVar52;
  auVar97._24_4_ = uVar52;
  auVar97._28_4_ = uVar52;
  uVar52 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar99._4_4_ = uVar52;
  auVar99._0_4_ = uVar52;
  auVar99._8_4_ = uVar52;
  auVar99._12_4_ = uVar52;
  auVar99._16_4_ = uVar52;
  auVar99._20_4_ = uVar52;
  auVar99._24_4_ = uVar52;
  auVar99._28_4_ = uVar52;
  uVar52 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar101._4_4_ = uVar52;
  auVar101._0_4_ = uVar52;
  auVar101._8_4_ = uVar52;
  auVar101._12_4_ = uVar52;
  auVar101._16_4_ = uVar52;
  auVar101._20_4_ = uVar52;
  auVar101._24_4_ = uVar52;
  auVar101._28_4_ = uVar52;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1480 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1488 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_1490 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1498 = local_1480 ^ 0x20;
  uVar56 = local_1488 ^ 0x20;
  uVar55 = local_1490 ^ 0x20;
  iVar6 = (tray->tnear).field_0.i[k];
  auVar114._4_4_ = iVar6;
  auVar114._0_4_ = iVar6;
  auVar114._8_4_ = iVar6;
  auVar114._12_4_ = iVar6;
  auVar114._16_4_ = iVar6;
  auVar114._20_4_ = iVar6;
  auVar114._24_4_ = iVar6;
  auVar114._28_4_ = iVar6;
  iVar6 = (tray->tfar).field_0.i[k];
  local_11f8._4_4_ = iVar6;
  local_11f8._0_4_ = iVar6;
  local_11f8._8_4_ = iVar6;
  local_11f8._12_4_ = iVar6;
  local_11f8._16_4_ = iVar6;
  local_11f8._20_4_ = iVar6;
  local_11f8._24_4_ = iVar6;
  local_11f8._28_4_ = iVar6;
  local_1468 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  pNVar49 = stack + 1;
  do {
    local_1460 = pNVar49;
    if (local_1460 == stack) break;
    local_1478 = local_1460 + -1;
    sVar54 = local_1460[-1].ptr;
    do {
      if ((sVar54 & 8) == 0) {
        uVar50 = sVar54 & 0xfffffffffffffff0;
        fVar67 = *(float *)(ray + k * 4 + 0x70);
        auVar66._4_4_ = fVar67;
        auVar66._0_4_ = fVar67;
        auVar66._8_4_ = fVar67;
        auVar66._12_4_ = fVar67;
        auVar66._16_4_ = fVar67;
        auVar66._20_4_ = fVar67;
        auVar66._24_4_ = fVar67;
        auVar66._28_4_ = fVar67;
        pfVar2 = (float *)(uVar50 + 0x100 + local_1480);
        pfVar1 = (float *)(uVar50 + 0x40 + local_1480);
        auVar75._0_4_ = fVar67 * *pfVar2 + *pfVar1;
        auVar75._4_4_ = fVar67 * pfVar2[1] + pfVar1[1];
        auVar75._8_4_ = fVar67 * pfVar2[2] + pfVar1[2];
        auVar75._12_4_ = fVar67 * pfVar2[3] + pfVar1[3];
        auVar75._16_4_ = fVar67 * pfVar2[4] + pfVar1[4];
        auVar75._20_4_ = fVar67 * pfVar2[5] + pfVar1[5];
        auVar75._24_4_ = fVar67 * pfVar2[6] + pfVar1[6];
        auVar75._28_4_ = in_ZMM1._28_4_ + pfVar1[7];
        auVar75 = vsubps_avx(auVar75,auVar97);
        auVar37._4_4_ = fVar3 * auVar75._4_4_;
        auVar37._0_4_ = fVar3 * auVar75._0_4_;
        auVar37._8_4_ = fVar3 * auVar75._8_4_;
        auVar37._12_4_ = fVar3 * auVar75._12_4_;
        auVar37._16_4_ = fVar3 * auVar75._16_4_;
        auVar37._20_4_ = fVar3 * auVar75._20_4_;
        auVar37._24_4_ = fVar3 * auVar75._24_4_;
        auVar37._28_4_ = auVar75._28_4_;
        pfVar2 = (float *)(uVar50 + 0x100 + local_1488);
        pfVar1 = (float *)(uVar50 + 0x40 + local_1488);
        auVar86._0_4_ = fVar67 * *pfVar2 + *pfVar1;
        auVar86._4_4_ = fVar67 * pfVar2[1] + pfVar1[1];
        auVar86._8_4_ = fVar67 * pfVar2[2] + pfVar1[2];
        auVar86._12_4_ = fVar67 * pfVar2[3] + pfVar1[3];
        auVar86._16_4_ = fVar67 * pfVar2[4] + pfVar1[4];
        auVar86._20_4_ = fVar67 * pfVar2[5] + pfVar1[5];
        auVar86._24_4_ = fVar67 * pfVar2[6] + pfVar1[6];
        auVar86._28_4_ = in_ZMM2._28_4_ + pfVar1[7];
        auVar75 = vmaxps_avx(auVar114,auVar37);
        auVar37 = vsubps_avx(auVar86,auVar99);
        pfVar2 = (float *)(uVar50 + 0x100 + local_1490);
        auVar39._4_4_ = fVar4 * auVar37._4_4_;
        auVar39._0_4_ = fVar4 * auVar37._0_4_;
        auVar39._8_4_ = fVar4 * auVar37._8_4_;
        auVar39._12_4_ = fVar4 * auVar37._12_4_;
        auVar39._16_4_ = fVar4 * auVar37._16_4_;
        auVar39._20_4_ = fVar4 * auVar37._20_4_;
        auVar39._24_4_ = fVar4 * auVar37._24_4_;
        auVar39._28_4_ = auVar37._28_4_;
        pfVar1 = (float *)(uVar50 + 0x40 + local_1490);
        auVar89._0_4_ = fVar67 * *pfVar2 + *pfVar1;
        auVar89._4_4_ = fVar67 * pfVar2[1] + pfVar1[1];
        auVar89._8_4_ = fVar67 * pfVar2[2] + pfVar1[2];
        auVar89._12_4_ = fVar67 * pfVar2[3] + pfVar1[3];
        auVar89._16_4_ = fVar67 * pfVar2[4] + pfVar1[4];
        auVar89._20_4_ = fVar67 * pfVar2[5] + pfVar1[5];
        auVar89._24_4_ = fVar67 * pfVar2[6] + pfVar1[6];
        auVar89._28_4_ = in_ZMM3._28_4_ + pfVar1[7];
        auVar38 = vsubps_avx(auVar89,auVar101);
        auVar40._4_4_ = fVar5 * auVar38._4_4_;
        auVar40._0_4_ = fVar5 * auVar38._0_4_;
        auVar40._8_4_ = fVar5 * auVar38._8_4_;
        auVar40._12_4_ = fVar5 * auVar38._12_4_;
        auVar40._16_4_ = fVar5 * auVar38._16_4_;
        auVar40._20_4_ = fVar5 * auVar38._20_4_;
        auVar40._24_4_ = fVar5 * auVar38._24_4_;
        auVar40._28_4_ = auVar38._28_4_;
        auVar37 = vmaxps_avx(auVar39,auVar40);
        pfVar2 = (float *)(uVar50 + 0x100 + local_1498);
        auVar75 = vmaxps_avx(auVar75,auVar37);
        pfVar1 = (float *)(uVar50 + 0x40 + local_1498);
        auVar87._0_4_ = fVar67 * *pfVar2 + *pfVar1;
        auVar87._4_4_ = fVar67 * pfVar2[1] + pfVar1[1];
        auVar87._8_4_ = fVar67 * pfVar2[2] + pfVar1[2];
        auVar87._12_4_ = fVar67 * pfVar2[3] + pfVar1[3];
        auVar87._16_4_ = fVar67 * pfVar2[4] + pfVar1[4];
        auVar87._20_4_ = fVar67 * pfVar2[5] + pfVar1[5];
        auVar87._24_4_ = fVar67 * pfVar2[6] + pfVar1[6];
        auVar87._28_4_ = auVar38._28_4_ + pfVar1[7];
        auVar37 = vsubps_avx(auVar87,auVar97);
        auVar38._4_4_ = fVar3 * auVar37._4_4_;
        auVar38._0_4_ = fVar3 * auVar37._0_4_;
        auVar38._8_4_ = fVar3 * auVar37._8_4_;
        auVar38._12_4_ = fVar3 * auVar37._12_4_;
        auVar38._16_4_ = fVar3 * auVar37._16_4_;
        auVar38._20_4_ = fVar3 * auVar37._20_4_;
        auVar38._24_4_ = fVar3 * auVar37._24_4_;
        auVar38._28_4_ = auVar37._28_4_;
        auVar37 = vminps_avx(local_11f8,auVar38);
        pfVar2 = (float *)(uVar50 + 0x100 + uVar56);
        pfVar1 = (float *)(uVar50 + 0x40 + uVar56);
        auVar90._0_4_ = fVar67 * *pfVar2 + *pfVar1;
        auVar90._4_4_ = fVar67 * pfVar2[1] + pfVar1[1];
        auVar90._8_4_ = fVar67 * pfVar2[2] + pfVar1[2];
        auVar90._12_4_ = fVar67 * pfVar2[3] + pfVar1[3];
        auVar90._16_4_ = fVar67 * pfVar2[4] + pfVar1[4];
        auVar90._20_4_ = fVar67 * pfVar2[5] + pfVar1[5];
        auVar90._24_4_ = fVar67 * pfVar2[6] + pfVar1[6];
        auVar90._28_4_ = local_11f8._28_4_ + pfVar1[7];
        auVar38 = vsubps_avx(auVar90,auVar99);
        auVar41._4_4_ = fVar4 * auVar38._4_4_;
        auVar41._0_4_ = fVar4 * auVar38._0_4_;
        auVar41._8_4_ = fVar4 * auVar38._8_4_;
        auVar41._12_4_ = fVar4 * auVar38._12_4_;
        auVar41._16_4_ = fVar4 * auVar38._16_4_;
        auVar41._20_4_ = fVar4 * auVar38._20_4_;
        auVar41._24_4_ = fVar4 * auVar38._24_4_;
        auVar41._28_4_ = auVar38._28_4_;
        pfVar2 = (float *)(uVar50 + 0x100 + uVar55);
        pfVar1 = (float *)(uVar50 + 0x40 + uVar55);
        auVar95._0_4_ = fVar67 * *pfVar2 + *pfVar1;
        auVar95._4_4_ = fVar67 * pfVar2[1] + pfVar1[1];
        auVar95._8_4_ = fVar67 * pfVar2[2] + pfVar1[2];
        auVar95._12_4_ = fVar67 * pfVar2[3] + pfVar1[3];
        auVar95._16_4_ = fVar67 * pfVar2[4] + pfVar1[4];
        auVar95._20_4_ = fVar67 * pfVar2[5] + pfVar1[5];
        auVar95._24_4_ = fVar67 * pfVar2[6] + pfVar1[6];
        auVar95._28_4_ = in_ZMM4._28_4_ + pfVar1[7];
        auVar38 = vsubps_avx(auVar95,auVar101);
        auVar42._4_4_ = fVar5 * auVar38._4_4_;
        auVar42._0_4_ = fVar5 * auVar38._0_4_;
        auVar42._8_4_ = fVar5 * auVar38._8_4_;
        auVar42._12_4_ = fVar5 * auVar38._12_4_;
        auVar42._16_4_ = fVar5 * auVar38._16_4_;
        auVar42._20_4_ = fVar5 * auVar38._20_4_;
        auVar42._24_4_ = fVar5 * auVar38._24_4_;
        auVar42._28_4_ = auVar38._28_4_;
        in_ZMM4 = ZEXT3264(auVar42);
        auVar38 = vminps_avx(auVar41,auVar42);
        in_ZMM3 = ZEXT3264(auVar38);
        auVar37 = vminps_avx(auVar37,auVar38);
        auVar75 = vcmpps_avx(auVar75,auVar37,2);
        in_ZMM1 = ZEXT3264(auVar75);
        if (((uint)sVar54 & 7) == 6) {
          auVar37 = vcmpps_avx(*(undefined1 (*) [32])(uVar50 + 0x1c0),auVar66,2);
          auVar38 = vcmpps_avx(auVar66,*(undefined1 (*) [32])(uVar50 + 0x1e0),1);
          auVar38 = vandps_avx(auVar37,auVar38);
          auVar75 = vandps_avx(auVar38,auVar75);
          in_ZMM1 = ZEXT1664(auVar75._16_16_);
          auVar60 = vpackssdw_avx(auVar75._0_16_,auVar75._16_16_);
        }
        else {
          auVar60 = vpackssdw_avx(auVar75._0_16_,auVar75._16_16_);
        }
        in_ZMM2 = ZEXT3264(auVar37);
        auVar60 = vpsllw_avx(auVar60,0xf);
        auVar60 = vpacksswb_avx(auVar60,auVar60);
        unaff_RBP = (ulong)(byte)(SUB161(auVar60 >> 7,0) & 1 | (SUB161(auVar60 >> 0xf,0) & 1) << 1 |
                                  (SUB161(auVar60 >> 0x17,0) & 1) << 2 |
                                  (SUB161(auVar60 >> 0x1f,0) & 1) << 3 |
                                  (SUB161(auVar60 >> 0x27,0) & 1) << 4 |
                                  (SUB161(auVar60 >> 0x2f,0) & 1) << 5 |
                                  (SUB161(auVar60 >> 0x37,0) & 1) << 6 |
                                 SUB161(auVar60 >> 0x3f,0) << 7);
      }
      if ((sVar54 & 8) == 0) {
        if (unaff_RBP == 0) {
          uVar108 = 4;
        }
        else {
          uVar50 = sVar54 & 0xfffffffffffffff0;
          lVar57 = 0;
          if (unaff_RBP != 0) {
            for (; (unaff_RBP >> lVar57 & 1) == 0; lVar57 = lVar57 + 1) {
            }
          }
          uVar108 = 0;
          sVar54 = *(size_t *)(uVar50 + lVar57 * 8);
          uVar53 = unaff_RBP - 1 & unaff_RBP;
          if (uVar53 != 0) {
            local_1478->ptr = sVar54;
            lVar57 = 0;
            if (uVar53 != 0) {
              for (; (uVar53 >> lVar57 & 1) == 0; lVar57 = lVar57 + 1) {
              }
            }
            uVar51 = uVar53 - 1;
            while( true ) {
              local_1478 = local_1478 + 1;
              sVar54 = *(size_t *)(uVar50 + lVar57 * 8);
              uVar51 = uVar51 & uVar53;
              if (uVar51 == 0) break;
              local_1478->ptr = sVar54;
              lVar57 = 0;
              if (uVar51 != 0) {
                for (; (uVar51 >> lVar57 & 1) == 0; lVar57 = lVar57 + 1) {
                }
              }
              uVar53 = uVar51 - 1;
            }
            uVar108 = 0;
          }
        }
      }
      else {
        uVar108 = 6;
      }
    } while (uVar108 == 0);
    if (uVar108 == 6) {
      uVar108 = 0;
      local_14a0 = (ulong)((uint)sVar54 & 0xf) - 8;
      bVar58 = local_14a0 != 0;
      if (bVar58) {
        uVar50 = sVar54 & 0xfffffffffffffff0;
        uVar53 = 0;
        do {
          lVar57 = uVar53 * 0x140;
          fVar67 = *(float *)(ray + k * 4 + 0x70);
          pfVar2 = (float *)(uVar50 + 0x90 + lVar57);
          pfVar1 = (float *)(uVar50 + lVar57);
          auVar92._0_4_ = fVar67 * *pfVar2 + *pfVar1;
          auVar92._4_4_ = fVar67 * pfVar2[1] + pfVar1[1];
          auVar92._8_4_ = fVar67 * pfVar2[2] + pfVar1[2];
          auVar92._12_4_ = fVar67 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar50 + 0xa0 + lVar57);
          pfVar1 = (float *)(uVar50 + 0x10 + lVar57);
          auVar96._0_4_ = fVar67 * *pfVar2 + *pfVar1;
          auVar96._4_4_ = fVar67 * pfVar2[1] + pfVar1[1];
          auVar96._8_4_ = fVar67 * pfVar2[2] + pfVar1[2];
          auVar96._12_4_ = fVar67 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar50 + 0xb0 + lVar57);
          pfVar1 = (float *)(uVar50 + 0x20 + lVar57);
          auVar100._0_4_ = fVar67 * *pfVar2 + *pfVar1;
          auVar100._4_4_ = fVar67 * pfVar2[1] + pfVar1[1];
          auVar100._8_4_ = fVar67 * pfVar2[2] + pfVar1[2];
          auVar100._12_4_ = fVar67 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar50 + 0xc0 + lVar57);
          pfVar1 = (float *)(uVar50 + 0x30 + lVar57);
          auVar60._0_4_ = fVar67 * *pfVar2 + *pfVar1;
          auVar60._4_4_ = fVar67 * pfVar2[1] + pfVar1[1];
          auVar60._8_4_ = fVar67 * pfVar2[2] + pfVar1[2];
          auVar60._12_4_ = fVar67 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar50 + 0xd0 + lVar57);
          pfVar1 = (float *)(uVar50 + 0x40 + lVar57);
          auVar79._0_4_ = fVar67 * *pfVar2 + *pfVar1;
          auVar79._4_4_ = fVar67 * pfVar2[1] + pfVar1[1];
          auVar79._8_4_ = fVar67 * pfVar2[2] + pfVar1[2];
          auVar79._12_4_ = fVar67 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar50 + 0xe0 + lVar57);
          pfVar1 = (float *)(uVar50 + 0x50 + lVar57);
          auVar103._0_4_ = fVar67 * *pfVar2 + *pfVar1;
          auVar103._4_4_ = fVar67 * pfVar2[1] + pfVar1[1];
          auVar103._8_4_ = fVar67 * pfVar2[2] + pfVar1[2];
          auVar103._12_4_ = fVar67 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar50 + 0xf0 + lVar57);
          pfVar1 = (float *)(uVar50 + 0x60 + lVar57);
          auVar109._0_4_ = fVar67 * *pfVar2 + *pfVar1;
          auVar109._4_4_ = fVar67 * pfVar2[1] + pfVar1[1];
          auVar109._8_4_ = fVar67 * pfVar2[2] + pfVar1[2];
          auVar109._12_4_ = fVar67 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar50 + 0x100 + lVar57);
          pfVar1 = (float *)(uVar50 + 0x70 + lVar57);
          auVar113._0_4_ = fVar67 * *pfVar2 + *pfVar1;
          auVar113._4_4_ = fVar67 * pfVar2[1] + pfVar1[1];
          auVar113._8_4_ = fVar67 * pfVar2[2] + pfVar1[2];
          auVar113._12_4_ = fVar67 * pfVar2[3] + pfVar1[3];
          pfVar1 = (float *)(uVar50 + 0x110 + lVar57);
          pfVar2 = (float *)(uVar50 + 0x80 + lVar57);
          auVar61._0_4_ = fVar67 * *pfVar1 + *pfVar2;
          auVar61._4_4_ = fVar67 * pfVar1[1] + pfVar2[1];
          auVar61._8_4_ = fVar67 * pfVar1[2] + pfVar2[2];
          auVar61._12_4_ = fVar67 * pfVar1[3] + pfVar2[3];
          auVar60 = vsubps_avx(auVar92,auVar60);
          auVar68 = vsubps_avx(auVar96,auVar79);
          auVar63 = vsubps_avx(auVar100,auVar103);
          auVar79 = vsubps_avx(auVar109,auVar92);
          auVar64 = vsubps_avx(auVar113,auVar96);
          auVar61 = vsubps_avx(auVar61,auVar100);
          fVar78 = auVar61._0_4_;
          fVar115 = auVar68._0_4_;
          auVar62._0_4_ = fVar115 * fVar78;
          fVar16 = auVar61._4_4_;
          fVar118 = auVar68._4_4_;
          auVar62._4_4_ = fVar118 * fVar16;
          fVar23 = auVar61._8_4_;
          fVar119 = auVar68._8_4_;
          auVar62._8_4_ = fVar119 * fVar23;
          fVar30 = auVar61._12_4_;
          fVar120 = auVar68._12_4_;
          auVar62._12_4_ = fVar120 * fVar30;
          fVar91 = auVar64._0_4_;
          fVar102 = auVar63._0_4_;
          auVar68._0_4_ = fVar102 * fVar91;
          fVar17 = auVar64._4_4_;
          fVar105 = auVar63._4_4_;
          auVar68._4_4_ = fVar105 * fVar17;
          fVar24 = auVar64._8_4_;
          fVar106 = auVar63._8_4_;
          auVar68._8_4_ = fVar106 * fVar24;
          fVar31 = auVar64._12_4_;
          fVar107 = auVar63._12_4_;
          auVar68._12_4_ = fVar107 * fVar31;
          local_12b8 = vsubps_avx(auVar68,auVar62);
          fVar11 = auVar79._0_4_;
          auVar69._0_4_ = fVar102 * fVar11;
          fVar18 = auVar79._4_4_;
          auVar69._4_4_ = fVar105 * fVar18;
          fVar25 = auVar79._8_4_;
          auVar69._8_4_ = fVar106 * fVar25;
          fVar32 = auVar79._12_4_;
          auVar69._12_4_ = fVar107 * fVar32;
          fVar12 = auVar60._0_4_;
          auVar80._0_4_ = fVar78 * fVar12;
          fVar19 = auVar60._4_4_;
          auVar80._4_4_ = fVar16 * fVar19;
          fVar26 = auVar60._8_4_;
          auVar80._8_4_ = fVar23 * fVar26;
          fVar33 = auVar60._12_4_;
          auVar80._12_4_ = fVar30 * fVar33;
          local_12a8 = vsubps_avx(auVar80,auVar69);
          auVar81._0_4_ = fVar91 * fVar12;
          auVar81._4_4_ = fVar17 * fVar19;
          auVar81._8_4_ = fVar24 * fVar26;
          auVar81._12_4_ = fVar31 * fVar33;
          auVar116._0_4_ = fVar115 * fVar11;
          auVar116._4_4_ = fVar118 * fVar18;
          auVar116._8_4_ = fVar119 * fVar25;
          auVar116._12_4_ = fVar120 * fVar32;
          auVar79 = vsubps_avx(auVar116,auVar81);
          uVar52 = *(undefined4 *)(ray + k * 4);
          auVar117._4_4_ = uVar52;
          auVar117._0_4_ = uVar52;
          auVar117._8_4_ = uVar52;
          auVar117._12_4_ = uVar52;
          uVar52 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar121._4_4_ = uVar52;
          auVar121._0_4_ = uVar52;
          auVar121._8_4_ = uVar52;
          auVar121._12_4_ = uVar52;
          uVar52 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar123._4_4_ = uVar52;
          auVar123._0_4_ = uVar52;
          auVar123._8_4_ = uVar52;
          auVar123._12_4_ = uVar52;
          fVar67 = *(float *)(ray + k * 4 + 0x50);
          auVar60 = vsubps_avx(auVar92,auVar117);
          in_ZMM4 = ZEXT1664(auVar60);
          fVar76 = *(float *)(ray + k * 4 + 0x60);
          auVar68 = vsubps_avx(auVar96,auVar121);
          auVar63 = vsubps_avx(auVar100,auVar123);
          fVar13 = auVar63._0_4_;
          auVar122._0_4_ = fVar67 * fVar13;
          fVar20 = auVar63._4_4_;
          auVar122._4_4_ = fVar67 * fVar20;
          fVar27 = auVar63._8_4_;
          auVar122._8_4_ = fVar67 * fVar27;
          fVar34 = auVar63._12_4_;
          auVar122._12_4_ = fVar67 * fVar34;
          fVar14 = auVar68._0_4_;
          auVar124._0_4_ = fVar76 * fVar14;
          fVar21 = auVar68._4_4_;
          auVar124._4_4_ = fVar76 * fVar21;
          fVar28 = auVar68._8_4_;
          auVar124._8_4_ = fVar76 * fVar28;
          fVar35 = auVar68._12_4_;
          auVar124._12_4_ = fVar76 * fVar35;
          auVar68 = vsubps_avx(auVar124,auVar122);
          fVar77 = *(float *)(ray + k * 4 + 0x40);
          fVar15 = auVar60._0_4_;
          auVar63._0_4_ = fVar76 * fVar15;
          fVar22 = auVar60._4_4_;
          auVar63._4_4_ = fVar76 * fVar22;
          fVar29 = auVar60._8_4_;
          auVar63._8_4_ = fVar76 * fVar29;
          fVar36 = auVar60._12_4_;
          auVar63._12_4_ = fVar76 * fVar36;
          auVar70._0_4_ = fVar77 * fVar13;
          auVar70._4_4_ = fVar77 * fVar20;
          auVar70._8_4_ = fVar77 * fVar27;
          auVar70._12_4_ = fVar77 * fVar34;
          auVar63 = vsubps_avx(auVar70,auVar63);
          auVar71._0_4_ = fVar77 * fVar14;
          auVar71._4_4_ = fVar77 * fVar21;
          auVar71._8_4_ = fVar77 * fVar28;
          auVar71._12_4_ = fVar77 * fVar35;
          auVar82._0_4_ = fVar67 * fVar15;
          auVar82._4_4_ = fVar67 * fVar22;
          auVar82._8_4_ = fVar67 * fVar29;
          auVar82._12_4_ = fVar67 * fVar36;
          auVar64 = vsubps_avx(auVar82,auVar71);
          auVar83._0_4_ =
               fVar77 * local_12b8._0_4_ + fVar67 * local_12a8._0_4_ + fVar76 * auVar79._0_4_;
          auVar83._4_4_ =
               fVar77 * local_12b8._4_4_ + fVar67 * local_12a8._4_4_ + fVar76 * auVar79._4_4_;
          auVar83._8_4_ =
               fVar77 * local_12b8._8_4_ + fVar67 * local_12a8._8_4_ + fVar76 * auVar79._8_4_;
          auVar83._12_4_ =
               fVar77 * local_12b8._12_4_ + fVar67 * local_12a8._12_4_ + fVar76 * auVar79._12_4_;
          in_ZMM2 = ZEXT1664(auVar83);
          auVar72._8_4_ = 0x80000000;
          auVar72._0_8_ = 0x8000000080000000;
          auVar72._12_4_ = 0x80000000;
          auVar60 = vandps_avx(auVar83,auVar72);
          uVar108 = auVar60._0_4_;
          auVar98._0_4_ =
               (float)(uVar108 ^
                      (uint)(fVar11 * auVar68._0_4_ +
                            fVar78 * auVar64._0_4_ + fVar91 * auVar63._0_4_));
          uVar110 = auVar60._4_4_;
          auVar98._4_4_ =
               (float)(uVar110 ^
                      (uint)(fVar18 * auVar68._4_4_ +
                            fVar16 * auVar64._4_4_ + fVar17 * auVar63._4_4_));
          uVar111 = auVar60._8_4_;
          auVar98._8_4_ =
               (float)(uVar111 ^
                      (uint)(fVar25 * auVar68._8_4_ +
                            fVar23 * auVar64._8_4_ + fVar24 * auVar63._8_4_));
          uVar112 = auVar60._12_4_;
          auVar98._12_4_ =
               (float)(uVar112 ^
                      (uint)(fVar32 * auVar68._12_4_ +
                            fVar30 * auVar64._12_4_ + fVar31 * auVar63._12_4_));
          auVar104._0_4_ =
               (float)(uVar108 ^
                      (uint)(auVar68._0_4_ * fVar12 +
                            fVar102 * auVar64._0_4_ + auVar63._0_4_ * fVar115));
          auVar104._4_4_ =
               (float)(uVar110 ^
                      (uint)(auVar68._4_4_ * fVar19 +
                            fVar105 * auVar64._4_4_ + auVar63._4_4_ * fVar118));
          auVar104._8_4_ =
               (float)(uVar111 ^
                      (uint)(auVar68._8_4_ * fVar26 +
                            fVar106 * auVar64._8_4_ + auVar63._8_4_ * fVar119));
          auVar104._12_4_ =
               (float)(uVar112 ^
                      (uint)(auVar68._12_4_ * fVar33 +
                            fVar107 * auVar64._12_4_ + auVar63._12_4_ * fVar120));
          auVar63 = ZEXT416(0) << 0x20;
          auVar60 = vcmpps_avx(auVar98,auVar63,5);
          auVar68 = vcmpps_avx(auVar104,auVar63,5);
          auVar60 = vandps_avx(auVar60,auVar68);
          auVar73._8_4_ = 0x7fffffff;
          auVar73._0_8_ = 0x7fffffff7fffffff;
          auVar73._12_4_ = 0x7fffffff;
          auVar68 = vandps_avx(auVar83,auVar73);
          in_ZMM3 = ZEXT1664(auVar68);
          auVar63 = vcmpps_avx(auVar63,auVar83,4);
          in_ZMM1 = ZEXT1664(auVar63);
          auVar60 = vandps_avx(auVar60,auVar63);
          auVar64._0_4_ = auVar104._0_4_ + auVar98._0_4_;
          auVar64._4_4_ = auVar104._4_4_ + auVar98._4_4_;
          auVar64._8_4_ = auVar104._8_4_ + auVar98._8_4_;
          auVar64._12_4_ = auVar104._12_4_ + auVar98._12_4_;
          auVar63 = vcmpps_avx(auVar64,auVar68,2);
          auVar64 = auVar63 & auVar60;
          if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar64[0xf] < '\0') {
            auVar60 = vandps_avx(auVar60,auVar63);
            auVar93._0_4_ =
                 (float)(uVar108 ^
                        (uint)(local_12b8._0_4_ * fVar15 +
                              local_12a8._0_4_ * fVar14 + fVar13 * auVar79._0_4_));
            auVar93._4_4_ =
                 (float)(uVar110 ^
                        (uint)(local_12b8._4_4_ * fVar22 +
                              local_12a8._4_4_ * fVar21 + fVar20 * auVar79._4_4_));
            auVar93._8_4_ =
                 (float)(uVar111 ^
                        (uint)(local_12b8._8_4_ * fVar29 +
                              local_12a8._8_4_ * fVar28 + fVar27 * auVar79._8_4_));
            auVar93._12_4_ =
                 (float)(uVar112 ^
                        (uint)(local_12b8._12_4_ * fVar36 +
                              local_12a8._12_4_ * fVar35 + fVar34 * auVar79._12_4_));
            in_ZMM4 = ZEXT1664(auVar93);
            fVar67 = *(float *)(ray + k * 4 + 0x30);
            fVar76 = auVar68._0_4_;
            auVar65._0_4_ = fVar76 * fVar67;
            fVar77 = auVar68._4_4_;
            auVar65._4_4_ = fVar77 * fVar67;
            fVar78 = auVar68._8_4_;
            auVar65._8_4_ = fVar78 * fVar67;
            fVar91 = auVar68._12_4_;
            auVar65._12_4_ = fVar91 * fVar67;
            auVar63 = vcmpps_avx(auVar65,auVar93,1);
            fVar67 = *(float *)(ray + k * 4 + 0x80);
            auVar74._0_4_ = fVar76 * fVar67;
            auVar74._4_4_ = fVar77 * fVar67;
            auVar74._8_4_ = fVar78 * fVar67;
            auVar74._12_4_ = fVar91 * fVar67;
            auVar64 = vcmpps_avx(auVar93,auVar74,2);
            in_ZMM1 = ZEXT1664(auVar64);
            auVar63 = vandps_avx(auVar63,auVar64);
            auVar64 = auVar60 & auVar63;
            if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar64[0xf] < '\0') {
              auVar60 = vandps_avx(auVar60,auVar63);
              local_14c8 = auVar79._0_8_;
              uStack_14c0 = auVar79._8_8_;
              local_1298 = local_14c8;
              uStack_1290 = uStack_14c0;
              pSVar8 = context->scene;
              auVar68 = vrcpps_avx(auVar68);
              fVar67 = auVar68._0_4_;
              auVar84._0_4_ = fVar76 * fVar67;
              fVar76 = auVar68._4_4_;
              auVar84._4_4_ = fVar77 * fVar76;
              fVar77 = auVar68._8_4_;
              auVar84._8_4_ = fVar78 * fVar77;
              fVar78 = auVar68._12_4_;
              auVar84._12_4_ = fVar91 * fVar78;
              auVar88._8_4_ = 0x3f800000;
              auVar88._0_8_ = &DAT_3f8000003f800000;
              auVar88._12_4_ = 0x3f800000;
              in_ZMM3 = ZEXT1664(auVar88);
              auVar68 = vsubps_avx(auVar88,auVar84);
              fVar67 = fVar67 + fVar67 * auVar68._0_4_;
              fVar76 = fVar76 + fVar76 * auVar68._4_4_;
              fVar77 = fVar77 + fVar77 * auVar68._8_4_;
              fVar78 = fVar78 + fVar78 * auVar68._12_4_;
              local_12c8[0] = fVar67 * auVar93._0_4_;
              local_12c8[1] = fVar76 * auVar93._4_4_;
              local_12c8[2] = fVar77 * auVar93._8_4_;
              local_12c8[3] = fVar78 * auVar93._12_4_;
              local_12e8._0_4_ = fVar67 * auVar98._0_4_;
              local_12e8._4_4_ = fVar76 * auVar98._4_4_;
              local_12e8._8_4_ = fVar77 * auVar98._8_4_;
              local_12e8._12_4_ = fVar78 * auVar98._12_4_;
              in_ZMM2 = ZEXT1664(local_12e8);
              local_12d8._0_4_ = fVar67 * auVar104._0_4_;
              local_12d8._4_4_ = fVar76 * auVar104._4_4_;
              local_12d8._8_4_ = fVar77 * auVar104._8_4_;
              local_12d8._12_4_ = fVar78 * auVar104._12_4_;
              in_ZMM1 = ZEXT1664(local_12d8);
              uVar52 = vmovmskps_avx(auVar60);
              local_1518 = CONCAT44((int)((ulong)pSVar8 >> 0x20),uVar52);
              do {
                uVar51 = 0;
                if (local_1518 != 0) {
                  for (; (local_1518 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                  }
                }
                uVar108 = *(uint *)(lVar57 + uVar50 + 0x120 + uVar51 * 4);
                local_1470 = (ulong)uVar108;
                pGVar9 = (pSVar8->geometries).items[local_1470].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  local_1518 = local_1518 ^ 1L << (uVar51 & 0x3f);
                  bVar59 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar59 = false;
                }
                else {
                  uVar52 = *(undefined4 *)(ray + k * 4 + 0x80);
                  uVar7 = *(undefined4 *)(local_12e8 + uVar51 * 4);
                  local_1258._4_4_ = uVar7;
                  local_1258._0_4_ = uVar7;
                  local_1258._8_4_ = uVar7;
                  local_1258._12_4_ = uVar7;
                  in_ZMM1 = ZEXT1664(local_1258);
                  uVar7 = *(undefined4 *)(local_12d8 + uVar51 * 4);
                  local_1248._4_4_ = uVar7;
                  local_1248._0_4_ = uVar7;
                  local_1248._8_4_ = uVar7;
                  local_1248._12_4_ = uVar7;
                  in_ZMM2 = ZEXT1664(local_1248);
                  *(float *)(ray + k * 4 + 0x80) = local_12c8[uVar51];
                  args.context = context->user;
                  local_1228 = vshufps_avx(ZEXT416(uVar108),ZEXT416(uVar108),0);
                  uVar7 = *(undefined4 *)(lVar57 + uVar50 + 0x130 + uVar51 * 4);
                  local_1238._4_4_ = uVar7;
                  local_1238._0_4_ = uVar7;
                  local_1238._8_4_ = uVar7;
                  local_1238._12_4_ = uVar7;
                  in_ZMM3 = ZEXT1664(local_1238);
                  uVar7 = *(undefined4 *)(local_12b8 + uVar51 * 4);
                  auVar94._4_4_ = uVar7;
                  auVar94._0_4_ = uVar7;
                  auVar94._8_4_ = uVar7;
                  auVar94._12_4_ = uVar7;
                  in_ZMM4 = ZEXT1664(auVar94);
                  local_1278 = *(undefined4 *)(local_12a8 + uVar51 * 4);
                  local_1268 = *(undefined4 *)((long)&local_1298 + uVar51 * 4);
                  local_1288[0] = (RTCHitN)(char)uVar7;
                  local_1288[1] = (RTCHitN)(char)((uint)uVar7 >> 8);
                  local_1288[2] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
                  local_1288[3] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
                  local_1288[4] = (RTCHitN)(char)uVar7;
                  local_1288[5] = (RTCHitN)(char)((uint)uVar7 >> 8);
                  local_1288[6] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
                  local_1288[7] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
                  local_1288[8] = (RTCHitN)(char)uVar7;
                  local_1288[9] = (RTCHitN)(char)((uint)uVar7 >> 8);
                  local_1288[10] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
                  local_1288[0xb] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
                  local_1288[0xc] = (RTCHitN)(char)uVar7;
                  local_1288[0xd] = (RTCHitN)(char)((uint)uVar7 >> 8);
                  local_1288[0xe] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
                  local_1288[0xf] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
                  uStack_1274 = local_1278;
                  uStack_1270 = local_1278;
                  uStack_126c = local_1278;
                  uStack_1264 = local_1268;
                  uStack_1260 = local_1268;
                  uStack_125c = local_1268;
                  vcmpps_avx(ZEXT1632(local_1228),ZEXT1632(local_1228),0xf);
                  uStack_1214 = (args.context)->instID[0];
                  local_1218 = uStack_1214;
                  uStack_1210 = uStack_1214;
                  uStack_120c = uStack_1214;
                  uStack_1208 = (args.context)->instPrimID[0];
                  uStack_1204 = uStack_1208;
                  uStack_1200 = uStack_1208;
                  uStack_11fc = uStack_1208;
                  local_14b8 = *local_1468;
                  uStack_14b0 = local_1468[1];
                  args.valid = (int *)&local_14b8;
                  args.geometryUserPtr = pGVar9->userPtr;
                  args.hit = local_1288;
                  args.N = 4;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    in_ZMM2 = ZEXT1664(local_1248);
                    in_ZMM3 = ZEXT1664(local_1238);
                    in_ZMM4 = ZEXT1664(auVar94);
                    (*pGVar9->occlusionFilterN)(&args);
                    in_ZMM1._8_56_ = extraout_var;
                    in_ZMM1._0_8_ = extraout_XMM1_Qa;
                  }
                  auVar47._8_8_ = uStack_14b0;
                  auVar47._0_8_ = local_14b8;
                  if (auVar47 == (undefined1  [16])0x0) {
                    auVar60 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar60 = auVar60 ^ _DAT_01febe20;
                  }
                  else {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
                      in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
                      (*p_Var10)(&args);
                    }
                    auVar48._8_8_ = uStack_14b0;
                    auVar48._0_8_ = local_14b8;
                    auVar68 = vpcmpeqd_avx((undefined1  [16])0x0,auVar48);
                    auVar60 = auVar68 ^ _DAT_01febe20;
                    auVar85._8_4_ = 0xff800000;
                    auVar85._0_8_ = 0xff800000ff800000;
                    auVar85._12_4_ = 0xff800000;
                    in_ZMM2 = ZEXT1664(auVar85);
                    auVar68 = vblendvps_avx(auVar85,*(undefined1 (*) [16])(args.ray + 0x80),auVar68)
                    ;
                    in_ZMM1 = ZEXT1664(auVar68);
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar68;
                  }
                  auVar60 = vpslld_avx(auVar60,0x1f);
                  bVar45 = (auVar60 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                  bVar46 = (auVar60 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                  bVar44 = (auVar60 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                  bVar43 = -1 < auVar60[0xf];
                  bVar59 = ((bVar45 && bVar46) && bVar44) && bVar43;
                  if (((bVar45 && bVar46) && bVar44) && bVar43) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar52;
                    local_1518 = local_1518 ^ 1L << (uVar51 & 0x3f);
                  }
                }
                uVar108 = 0;
                if (!bVar59) {
                  if (bVar58) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    uVar108 = 1;
                  }
                  goto LAB_00442597;
                }
              } while (local_1518 != 0);
            }
          }
          uVar108 = 0;
          uVar53 = uVar53 + 1;
          bVar58 = uVar53 < local_14a0;
        } while (uVar53 != local_14a0);
      }
    }
LAB_00442597:
    pNVar49 = local_1478;
  } while ((uVar108 & 3) == 0);
  return local_1460 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }